

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

EXTRA_DESCR_DATA * new_extra_descr(void)

{
  EXTRA_DESCR_DATA *ed;
  EXTRA_DESCR_DATA *local_8;
  
  if (extra_descr_free == (EXTRA_DESCR_DATA *)0x0) {
    local_8 = (EXTRA_DESCR_DATA *)operator_new(0x20);
  }
  else {
    local_8 = extra_descr_free;
    extra_descr_free = extra_descr_free->next;
  }
  local_8->keyword = str_empty;
  local_8->description = str_empty;
  local_8->valid = true;
  return local_8;
}

Assistant:

EXTRA_DESCR_DATA *new_extra_descr(void)
{
	EXTRA_DESCR_DATA *ed;

	if (extra_descr_free == nullptr)
	{
		ed = new EXTRA_DESCR_DATA;
	}
	else
	{
		ed = extra_descr_free;
		extra_descr_free = extra_descr_free->next;
	}

	ed->keyword = &str_empty[0];
	ed->description = &str_empty[0];

	ed->valid = true;
	return ed;
}